

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

PROPERTIES_HANDLE properties_create(void)

{
  AMQP_VALUE pAVar1;
  PROPERTIES_HANDLE local_10;
  PROPERTIES_INSTANCE *properties_instance;
  
  local_10 = (PROPERTIES_HANDLE)malloc(8);
  if (local_10 != (PROPERTIES_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x73);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (PROPERTIES_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

PROPERTIES_HANDLE properties_create(void)
{
    PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)malloc(sizeof(PROPERTIES_INSTANCE));
    if (properties_instance != NULL)
    {
        properties_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(115);
        if (properties_instance->composite_value == NULL)
        {
            free(properties_instance);
            properties_instance = NULL;
        }
    }

    return properties_instance;
}